

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcTypeProduct::~IfcTypeProduct(IfcTypeProduct *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  void *pvVar3;
  
  *(undefined8 *)&this->super_IfcTypeObject = 0x836d88;
  *(undefined8 *)&this->field_0x148 = 0x836e28;
  *(undefined8 *)&(this->super_IfcTypeObject).field_0x88 = 0x836db0;
  (this->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x836dd8;
  *(undefined8 *)&(this->super_IfcTypeObject).field_0xf0 = 0x836e00;
  pcVar2 = (this->Tag).ptr._M_dataplus._M_p;
  paVar1 = &(this->Tag).ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pvVar3 = *(void **)&(this->super_IfcTypeObject).field_0x100;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&this->field_0x110 - (long)pvVar3);
  }
  IfcTypeObject::~IfcTypeObject(&this->super_IfcTypeObject,&PTR_construction_vtable_24__00836e40);
  operator_delete(this,0x160);
  return;
}

Assistant:

IfcTypeProduct() : Object("IfcTypeProduct") {}